

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O2

void basist::decoder_etc_block::get_block_colors5
               (color32 *pBlock_colors,color32 *base_color5,uint32_t inten_table)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  byte bVar10;
  int iVar11;
  
  bVar1 = (base_color5->field_0).field_0.r;
  bVar2 = (base_color5->field_0).field_0.g;
  bVar10 = (base_color5->field_0).field_0.b;
  bVar10 = bVar10 >> 2 | bVar10 * '\b';
  uVar9 = (ulong)inten_table;
  uVar3 = (uint)(byte)(bVar1 >> 2 | bVar1 * '\b');
  iVar11 = (&g_etc1_inten_tables)[uVar9 * 4];
  iVar4 = 0;
  iVar7 = iVar11 + uVar3;
  if ((int)(iVar11 + uVar3) < 1) {
    iVar7 = iVar4;
  }
  if (0xfe < iVar7) {
    iVar7 = 0xff;
  }
  uVar8 = (uint)(byte)(bVar2 >> 2 | bVar2 * '\b');
  iVar5 = iVar11 + uVar8;
  if ((int)(iVar11 + uVar8) < 1) {
    iVar5 = iVar4;
  }
  if (0xfe < iVar5) {
    iVar5 = 0xff;
  }
  iVar11 = iVar11 + (uint)bVar10;
  if (iVar11 < 1) {
    iVar11 = iVar4;
  }
  if (0xfe < iVar11) {
    iVar11 = 0xff;
  }
  iVar6 = (&DAT_001ce784)[uVar9 * 4];
  (pBlock_colors->field_0).field_0.r = (uint8_t)iVar7;
  (pBlock_colors->field_0).field_0.g = (uint8_t)iVar5;
  (pBlock_colors->field_0).field_0.b = (uint8_t)iVar11;
  iVar11 = iVar6 + uVar3;
  if ((int)(iVar6 + uVar3) < 1) {
    iVar11 = iVar4;
  }
  if (0xfe < iVar11) {
    iVar11 = 0xff;
  }
  iVar7 = iVar6 + uVar8;
  if ((int)(iVar6 + uVar8) < 1) {
    iVar7 = iVar4;
  }
  (pBlock_colors->field_0).field_0.a = 0xff;
  iVar5 = 0xff;
  if (0xfe < iVar7) {
    iVar7 = iVar5;
  }
  iVar6 = iVar6 + (uint)bVar10;
  if (iVar6 < 1) {
    iVar6 = iVar4;
  }
  if (0xfe < iVar6) {
    iVar6 = iVar5;
  }
  pBlock_colors[1].field_0.field_0.r = (uint8_t)iVar11;
  pBlock_colors[1].field_0.field_0.g = (uint8_t)iVar7;
  pBlock_colors[1].field_0.field_0.b = (uint8_t)iVar6;
  pBlock_colors[1].field_0.field_0.a = 0xff;
  iVar11 = (&DAT_001ce788)[uVar9 * 4];
  iVar7 = iVar11 + uVar3;
  if ((int)(iVar11 + uVar3) < 1) {
    iVar7 = iVar4;
  }
  if (0xfe < iVar7) {
    iVar7 = iVar5;
  }
  iVar6 = iVar11 + uVar8;
  if ((int)(iVar11 + uVar8) < 1) {
    iVar6 = iVar4;
  }
  if (0xfe < iVar6) {
    iVar6 = iVar5;
  }
  iVar11 = iVar11 + (uint)bVar10;
  if (iVar11 < 1) {
    iVar11 = iVar4;
  }
  if (0xfe < iVar11) {
    iVar11 = iVar5;
  }
  pBlock_colors[2].field_0.field_0.r = (uint8_t)iVar7;
  pBlock_colors[2].field_0.field_0.g = (uint8_t)iVar6;
  pBlock_colors[2].field_0.field_0.b = (uint8_t)iVar11;
  pBlock_colors[2].field_0.field_0.a = 0xff;
  iVar11 = (&DAT_001ce78c)[uVar9 * 4];
  iVar7 = uVar3 + iVar11;
  if ((int)(uVar3 + iVar11) < 1) {
    iVar7 = iVar4;
  }
  if (0xfe < iVar7) {
    iVar7 = iVar5;
  }
  iVar5 = uVar8 + iVar11;
  if ((int)(uVar8 + iVar11) < 1) {
    iVar5 = iVar4;
  }
  if (0xfe < iVar5) {
    iVar5 = 0xff;
  }
  iVar11 = iVar11 + (uint)bVar10;
  if (iVar11 < 1) {
    iVar11 = iVar4;
  }
  if (0xfe < iVar11) {
    iVar11 = 0xff;
  }
  pBlock_colors[3].field_0.field_0.r = (uint8_t)iVar7;
  pBlock_colors[3].field_0.field_0.g = (uint8_t)iVar5;
  pBlock_colors[3].field_0.field_0.b = (uint8_t)iVar11;
  pBlock_colors[3].field_0.field_0.a = 0xff;
  return;
}

Assistant:

static void get_block_colors5(color32* pBlock_colors, const color32& base_color5, uint32_t inten_table)
		{
			color32 b(base_color5);

			b.r = (b.r << 3) | (b.r >> 2);
			b.g = (b.g << 3) | (b.g >> 2);
			b.b = (b.b << 3) | (b.b >> 2);

			const int* pInten_table = g_etc1_inten_tables[inten_table];

			pBlock_colors[0].set(clamp255(b.r + pInten_table[0]), clamp255(b.g + pInten_table[0]), clamp255(b.b + pInten_table[0]), 255);
			pBlock_colors[1].set(clamp255(b.r + pInten_table[1]), clamp255(b.g + pInten_table[1]), clamp255(b.b + pInten_table[1]), 255);
			pBlock_colors[2].set(clamp255(b.r + pInten_table[2]), clamp255(b.g + pInten_table[2]), clamp255(b.b + pInten_table[2]), 255);
			pBlock_colors[3].set(clamp255(b.r + pInten_table[3]), clamp255(b.g + pInten_table[3]), clamp255(b.b + pInten_table[3]), 255);
		}